

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall
pbrt::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,StatsAccumulator *accum)

{
  long lVar1;
  long *in_FS_OFFSET;
  int64_t in_stack_00000048;
  int64_t in_stack_00000050;
  int64_t in_stack_00000058;
  int64_t in_stack_00000060;
  char *in_stack_00000068;
  StatsAccumulator *in_stack_00000070;
  
  StatsAccumulator::ReportIntDistribution
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
             in_stack_00000050,in_stack_00000048);
  *(undefined8 *)(*in_FS_OFFSET + -0x618) = 0;
  *(undefined8 *)(*in_FS_OFFSET + -0x610) = 0;
  lVar1 = std::numeric_limits<long>::max();
  *(long *)(*in_FS_OFFSET + -0x608) = lVar1;
  lVar1 = std::numeric_limits<long>::lowest();
  *(long *)(*in_FS_OFFSET + -0x600) = lVar1;
  return;
}

Assistant:

BilinearPatchMesh::BilinearPatchMesh(const Transform &renderFromObject,
                                     bool reverseOrientation, std::vector<int> indices,
                                     std::vector<Point3f> P, std::vector<Normal3f> N,
                                     std::vector<Point2f> UV, std::vector<int> fIndices,
                                     PiecewiseConstant2D *imageDist, Allocator alloc)
    : reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject.SwapsHandedness()),
      nPatches(indices.size() / 4),
      nVertices(P.size()),
      imageDistribution(imageDist) {
    CHECK_EQ((indices.size() % 4), 0);
    ++nBilinearMeshes;
    nBlps += nPatches;

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(P.size(), std::numeric_limits<int>::max());
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());

    vertexIndices = intBufferCache->LookupOrAdd(indices, alloc);

    blpBytes += sizeof(*this);

    // Transform mesh vertices to rendering space
    for (Point3f &p : P)
        p = renderFromObject(p);
    p = point3BufferCache->LookupOrAdd(P, alloc);

    // Copy _UV_ and _N_ vertex data, if present
    if (!UV.empty()) {
        CHECK_EQ(nVertices, UV.size());
        uv = point2BufferCache->LookupOrAdd(UV, alloc);
    }
    if (!N.empty()) {
        CHECK_EQ(nVertices, N.size());
        for (Normal3f &n : N) {
            n = renderFromObject(n);
            if (reverseOrientation)
                n = -n;
        }
        n = normal3BufferCache->LookupOrAdd(N, alloc);
    }

    if (!fIndices.empty()) {
        CHECK_EQ(nPatches, fIndices.size());
        faceIndices = intBufferCache->LookupOrAdd(fIndices, alloc);
    }
}